

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_readPDOassignCA(ecx_contextt *context,uint16 Slave,uint16 PDOassign)

{
  int local_2c;
  int local_28;
  int rdl;
  int bsize;
  int wkc;
  ushort local_18;
  uint16 subidx;
  uint16 idx;
  uint16 subidxloop;
  uint16 nidx;
  uint16 idxloop;
  uint16 PDOassign_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  local_28 = 0;
  local_2c = 0x202;
  context->PDOassign->n = '\0';
  idx = PDOassign;
  subidxloop = Slave;
  _nidx = context;
  rdl = ecx_SDOread(context,Slave,PDOassign,'\0','\x01',&local_2c,context->PDOassign,700000);
  if ((0 < rdl) && (_nidx->PDOassign->n != '\0')) {
    local_18 = (ushort)_nidx->PDOassign->n;
    local_28 = 0;
    for (subidx = 1; subidx <= local_18; subidx = subidx + 1) {
      wkc._0_2_ = _nidx->PDOassign->index[(int)(subidx - 1)];
      if ((uint16)wkc != 0) {
        local_2c = 0x402;
        _nidx->PDOdesc->n = '\0';
        rdl = ecx_SDOread(_nidx,subidxloop,(uint16)wkc,'\0','\x01',&local_2c,_nidx->PDOdesc,700000);
        bsize._2_2_ = (ushort)_nidx->PDOdesc->n;
        for (wkc._2_2_ = 1; wkc._2_2_ <= bsize._2_2_; wkc._2_2_ = wkc._2_2_ + 1) {
          local_28 = (_nidx->PDOdesc->PDO[(int)(wkc._2_2_ - 1)] & 0xff) + local_28;
        }
      }
    }
  }
  return local_28;
}

Assistant:

int ecx_readPDOassignCA(ecx_contextt *context, uint16 Slave, uint16 PDOassign)
{
   uint16 idxloop, nidx, subidxloop, idx, subidx;
   int wkc, bsize = 0, rdl;

   /* find maximum size of PDOassign buffer */
   rdl = sizeof(ec_PDOassignt); 
   context->PDOassign->n=0;
   /* read rxPDOassign in CA mode, all subindexes are read in one struct */
   wkc = ecx_SDOread(context, Slave, PDOassign, 0x00, TRUE, &rdl, context->PDOassign, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (context->PDOassign->n > 0))
   {
      nidx = context->PDOassign->n;
      bsize = 0;
      /* for each PDO do */
      for (idxloop = 1; idxloop <= nidx; idxloop++)
      {
         /* get index from PDOassign struct */
         idx = etohs(context->PDOassign->index[idxloop - 1]);
         if (idx > 0)
         {
            rdl = sizeof(ec_PDOdesct); context->PDOdesc->n = 0;
            /* read SDO's that are mapped in PDO, CA mode */
            wkc = ecx_SDOread(context, Slave,idx, 0x00, TRUE, &rdl, context->PDOdesc, EC_TIMEOUTRXM);
            subidx = context->PDOdesc->n;
            /* extract all bitlengths of SDO's */
            for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
            {
               bsize += LO_BYTE(etohl(context->PDOdesc->PDO[subidxloop -1]));
            }
         }
      }
   }

   /* return total found bitlength (PDO) */
   return bsize;
}